

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  char *__s;
  size_type sVar2;
  bool bVar3;
  int iVar4;
  undefined8 extraout_RAX;
  long lVar5;
  int iVar6;
  string req_locale;
  string the_locale;
  string tests_data_path;
  string local_90;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"tests/","");
  if (1 < argc) {
    lVar5 = 2;
    iVar6 = 1;
    do {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_90,argv[lVar5 + -1],(allocator<char> *)&local_70);
      iVar4 = std::__cxx11::string::compare((char *)&local_90);
      sVar2 = local_50._M_string_length;
      if (iVar4 != 0) {
LAB_00190072:
        main_cold_1();
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_90._M_dataplus._M_p != &local_90.field_2) {
          operator_delete(local_90._M_dataplus._M_p,
                          CONCAT71(local_90.field_2._M_allocated_capacity._1_7_,
                                   local_90.field_2._M_local_buf[0]) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
        _Unwind_Resume(extraout_RAX);
      }
      if (argc <= (int)lVar5) {
        main_cold_2();
        goto LAB_00190072;
      }
      __s = argv[lVar5];
      strlen(__s);
      std::__cxx11::string::_M_replace((ulong)&local_50,0,(char *)sVar2,(ulong)__s);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p,
                        CONCAT71(local_90.field_2._M_allocated_capacity._1_7_,
                                 local_90.field_2._M_local_buf[0]) + 1);
      }
      lVar5 = lVar5 + 2;
      iVar6 = iVar6 + 2;
    } while (iVar6 < argc);
  }
  InitTestEngine((TestFailEventListener)0x0);
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  local_90._M_string_length = 0;
  local_90.field_2._M_local_buf[0] = '\0';
  bVar3 = flatbuffers::ReadEnvironmentVariable("FLATBUFFERS_TEST_LOCALE",&local_90);
  if (bVar3) {
    printf("The environment variable FLATBUFFERS_TEST_LOCALE=%s",local_90._M_dataplus._M_p);
    putchar(10);
    flatbuffers::RemoveStringQuotes(&local_70,&local_90);
    std::__cxx11::string::operator=((string *)&local_90,(string *)&local_70);
    paVar1 = &local_70.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != paVar1) {
      operator_delete(local_70._M_dataplus._M_p,
                      CONCAT71(local_70.field_2._M_allocated_capacity._1_7_,
                               local_70.field_2._M_local_buf[0]) + 1);
    }
    local_70._M_string_length = 0;
    local_70.field_2._M_local_buf[0] = '\0';
    local_70._M_dataplus._M_p = (pointer)paVar1;
    bVar3 = flatbuffers::SetGlobalTestLocale(local_90._M_dataplus._M_p,&local_70);
    TestEq<bool,bool>(true,bVar3,
                      "\'true\' != \'flatbuffers::SetGlobalTestLocale(req_locale.c_str(), &the_locale)\'"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/test.cpp"
                      ,0x6d5,"int main(int, const char **)");
    printf("The global C-locale changed: %s",local_70._M_dataplus._M_p);
    putchar(10);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != paVar1) {
      operator_delete(local_70._M_dataplus._M_p,
                      CONCAT71(local_70.field_2._M_allocated_capacity._1_7_,
                               local_70.field_2._M_local_buf[0]) + 1);
    }
  }
  std::operator+(&local_70,"/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/"
                 ,&local_50);
  std::__cxx11::string::operator=((string *)&local_50,(string *)&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,
                    CONCAT71(local_70.field_2._M_allocated_capacity._1_7_,
                             local_70.field_2._M_local_buf[0]) + 1);
  }
  flatbuffers::tests::anon_unknown_0::FlatBufferTests(&local_50);
  FlatBufferBuilderTest();
  if (testing_fails == 0) {
    printf("ALL TESTS PASSED");
  }
  else {
    printf("%d FAILED TESTS");
  }
  putchar(10);
  iVar6 = CloseTestEngine(false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,
                    CONCAT71(local_90.field_2._M_allocated_capacity._1_7_,
                             local_90.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  return iVar6;
}

Assistant:

int main(int argc, const char *argv[]) {
  std::string tests_data_path = "tests/";

  for (int argi = 1; argi < argc; argi++) {
    std::string arg = argv[argi];
    if (arg == "--test_path") {
      if (++argi >= argc) {
        fprintf(stderr, "error: missing path following: %s\n", arg.c_str());
        exit(1);
      }
      // Override default path if provided one.
      tests_data_path = argv[argi];

    } else {
      fprintf(stderr, "error: Unknown argument: %s\n", arg.c_str());
      exit(1);
    }
  }

  InitTestEngine();

  std::string req_locale;
  if (flatbuffers::ReadEnvironmentVariable("FLATBUFFERS_TEST_LOCALE",
                                           &req_locale)) {
    TEST_OUTPUT_LINE("The environment variable FLATBUFFERS_TEST_LOCALE=%s",
                     req_locale.c_str());
    req_locale = flatbuffers::RemoveStringQuotes(req_locale);
    std::string the_locale;
    TEST_ASSERT_FUNC(
        flatbuffers::SetGlobalTestLocale(req_locale.c_str(), &the_locale));
    TEST_OUTPUT_LINE("The global C-locale changed: %s", the_locale.c_str());
  }

#ifdef FLATBUFFERS_TEST_PATH_PREFIX
  tests_data_path =
      FLATBUFFERS_STRING(FLATBUFFERS_TEST_PATH_PREFIX) + tests_data_path;
#endif

  flatbuffers::tests::FlatBufferTests(tests_data_path);
  FlatBufferBuilderTest();

  if (!testing_fails) {
    TEST_OUTPUT_LINE("ALL TESTS PASSED");
  } else {
    TEST_OUTPUT_LINE("%d FAILED TESTS", testing_fails);
  }
  return CloseTestEngine();
}